

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

ParserGraph *
Omega_h::find_transition_predecessors
          (ParserGraph *__return_storage_ptr__,StateConfigs *scs,StatesInProgress *states,
          ParserGraph *states2scs,Configs *cs,GrammarPtr *grammar)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int i;
  const_reference pvVar4;
  type v;
  size_type sVar5;
  reference piVar6;
  type v_00;
  reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  element_type *peVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  int sc_j;
  int sc_i;
  value_type rhs_symbol;
  value_type *prod;
  value_type *config2;
  value_type config_j;
  int cis_j;
  value_type *config;
  value_type config_i;
  int cis_i;
  StateInProgress *state2;
  iterator iStack_88;
  int state_j;
  int local_7c;
  reference pAStack_78;
  int symbol;
  ActionInProgress *action;
  iterator __end2;
  iterator __begin2;
  vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_> *__range2;
  StateInProgress *state;
  int local_40;
  int state_i;
  GrammarPtr *grammar_local;
  Configs *cs_local;
  ParserGraph *states2scs_local;
  StatesInProgress *states_local;
  StateConfigs *scs_local;
  ParserGraph *out;
  
  iVar2 = size<Omega_h::StateConfig>(scs);
  make_graph_with_nnodes(__return_storage_ptr__,iVar2);
  local_40 = 0;
  do {
    iVar2 = size<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                      (states);
    if (iVar2 <= local_40) {
      return __return_storage_ptr__;
    }
    pvVar4 = at<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                       (states,local_40);
    v = std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>::
        operator*(pvVar4);
    __end2 = std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>::
             begin(&v->actions);
    action = (ActionInProgress *)
             std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>::end
                       (&v->actions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
                                       *)&action), bVar1) {
      pAStack_78 = __gnu_cxx::
                   __normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
                   ::operator*(&__end2);
      if ((pAStack_78->action).kind == ACTION_SHIFT) {
        sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&pAStack_78->context);
        if (sVar5 != 1) {
          fail("assertion %s failed at %s +%d\n","action.context.size() == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
               ,0x1f2);
        }
        iStack_88 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&pAStack_78->context)
        ;
        piVar6 = std::_Rb_tree_const_iterator<int>::operator*(&stack0xffffffffffffff78);
        local_7c = *piVar6;
        iVar2 = (pAStack_78->action).field_1.production;
        pvVar4 = at<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                           (states,iVar2);
        v_00 = std::
               unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
               ::operator*(pvVar4);
        for (config._4_4_ = 0; iVar3 = size<int>(&v->configs), config._4_4_ < iVar3;
            config._4_4_ = config._4_4_ + 1) {
          pvVar7 = at<int>(&v->configs,config._4_4_);
          pvVar8 = at<Omega_h::Config>(cs,*pvVar7);
          for (config2._4_4_ = 0; iVar3 = size<int>(&v_00->configs), config2._4_4_ < iVar3;
              config2._4_4_ = config2._4_4_ + 1) {
            pvVar7 = at<int>(&v_00->configs,config2._4_4_);
            pvVar9 = at<Omega_h::Config>(cs,*pvVar7);
            if ((pvVar8->production == pvVar9->production) && (pvVar8->dot + 1 == pvVar9->dot)) {
              peVar10 = std::
                        __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)grammar);
              pvVar11 = at<Omega_h::Grammar::Production>(&peVar10->productions,pvVar8->production);
              pvVar12 = at<int>(&pvVar11->rhs,pvVar8->dot);
              if (*pvVar12 == local_7c) {
                iVar3 = at(states2scs,local_40,config._4_4_);
                i = at(states2scs,iVar2,config2._4_4_);
                add_edge(__return_storage_ptr__,i,iVar3);
              }
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
      ::operator++(&__end2);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static ParserGraph find_transition_predecessors(StateConfigs const& scs,
    StatesInProgress const& states, ParserGraph const& states2scs,
    Configs const& cs, GrammarPtr grammar) {
  auto out = make_graph_with_nnodes(size(scs));
  for (int state_i = 0; state_i < size(states); ++state_i) {
    auto& state = *at(states, state_i);
    for (auto& action : state.actions) {
      if (action.action.kind != ACTION_SHIFT) continue;
      OMEGA_H_CHECK(action.context.size() == 1);
      auto symbol = *(action.context.begin());
      auto state_j = action.action.next_state;
      auto& state2 = *at(states, state_j);
      for (int cis_i = 0; cis_i < size(state.configs); ++cis_i) {
        auto config_i = at(state.configs, cis_i);
        auto& config = at(cs, config_i);
        for (int cis_j = 0; cis_j < size(state2.configs); ++cis_j) {
          auto config_j = at(state2.configs, cis_j);
          auto& config2 = at(cs, config_j);
          if (config.production == config2.production &&
              config.dot + 1 == config2.dot) {
            auto& prod = at(grammar->productions, config.production);
            auto rhs_symbol = at(prod.rhs, config.dot);
            if (rhs_symbol == symbol) {
              auto sc_i = at(states2scs, state_i, cis_i);
              auto sc_j = at(states2scs, state_j, cis_j);
              add_edge(out, sc_j, sc_i);
            }
          }
        }
      }
    }
  }
  return out;
}